

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintConstant(OutputContext *ctx,VmConstant *constant)

{
  VmValueType VVar1;
  uint uVar2;
  int iVar3;
  VariableData *pVVar4;
  VmBlock *pVVar5;
  TypeBase *pTVar6;
  FunctionData *pFVar7;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  
  VVar1 = (constant->super_VmValue).type.type;
  uVar2 = (constant->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_VOID) && (uVar2 == 0)) {
    pcVar11 = "{}";
LAB_001a88cf:
    Print(ctx,pcVar11);
    return;
  }
  if ((VVar1 == VM_TYPE_INT) && (uVar2 == 4)) {
    uVar2 = constant->iValue;
    pcVar11 = "%d";
LAB_001a8902:
    Print(ctx,pcVar11,(ulong)uVar2);
    return;
  }
  if ((VVar1 == VM_TYPE_DOUBLE) && (uVar2 == 8)) {
    Print(ctx,"%f",constant->dValue);
    return;
  }
  if ((VVar1 == VM_TYPE_LONG) && (uVar2 == 8)) {
    Print(ctx,"%lldl",constant->lValue);
    return;
  }
  if (VVar1 == VM_TYPE_POINTER) {
    pVVar4 = constant->container;
    if ((pVVar4 != (VariableData *)0x0) && (uVar2 = constant->iValue, uVar2 != 0)) {
      iVar3 = *(int *)&(pVVar4->name->name).end;
      pcVar11 = (pVVar4->name->name).begin;
      uVar9 = pVVar4->uniqueId;
      bVar8 = HasAddressTaken(pVVar4);
      pcVar10 = " (noalias)";
      if (bVar8) {
        pcVar10 = "";
      }
      Print(ctx,"%.*s.v%04x+0x%x%s",(ulong)(uint)(iVar3 - (int)pcVar11),pcVar11,(ulong)uVar9,
            (ulong)uVar2,pcVar10);
      return;
    }
    pVVar4 = constant->container;
    if (pVVar4 != (VariableData *)0x0) {
      iVar3 = *(int *)&(pVVar4->name->name).end;
      pcVar11 = (pVVar4->name->name).begin;
      uVar2 = pVVar4->uniqueId;
      bVar8 = HasAddressTaken(pVVar4);
      pcVar10 = " (noalias)";
      if (bVar8) {
        pcVar10 = "";
      }
      Print(ctx,"%.*s.v%04x%s",(ulong)(uint)(iVar3 - (int)pcVar11),pcVar11,(ulong)uVar2,pcVar10);
      return;
    }
  }
  switch(VVar1) {
  case VM_TYPE_BLOCK:
    pVVar5 = constant->bValue;
    pcVar11 = (pVVar5->name).begin;
    uVar9 = *(int *)&(pVVar5->name).end - (int)pcVar11;
    uVar2 = pVVar5->uniqueId;
    pcVar10 = "%.*s.b%d";
    break;
  case VM_TYPE_FUNCTION:
    pFVar7 = constant->fValue->function;
    if (pFVar7 == (FunctionData *)0x0) {
      if (VVar1 == VM_TYPE_FUNCTION) {
        pcVar11 = "global.f0000";
        goto LAB_001a88cf;
      }
      goto switchD_001a8a75_caseD_7;
    }
    pcVar11 = (pFVar7->name->name).begin;
    uVar9 = *(int *)&(pFVar7->name->name).end - (int)pcVar11;
    uVar2 = pFVar7->uniqueId;
    pcVar10 = "%.*s.f%04x";
    break;
  case VM_TYPE_POINTER:
    uVar2 = constant->iValue;
    pcVar11 = "0x%x";
    goto LAB_001a8902;
  default:
switchD_001a8a75_caseD_7:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0x54,"void PrintConstant(OutputContext &, VmConstant *)");
  case VM_TYPE_STRUCT:
    pTVar6 = (constant->super_VmValue).type.structType;
    Print(ctx,"{ %.*s }",(ulong)(uint)(*(int *)&(pTVar6->name).end - (int)(pTVar6->name).begin));
    return;
  }
  Print(ctx,pcVar10,(ulong)uVar9,pcVar11,(ulong)uVar2);
  return;
}

Assistant:

void PrintConstant(OutputContext &ctx, VmConstant *constant)
{
	if(constant->type == VmType::Void)
		Print(ctx, "{}");
	else if(constant->type == VmType::Int)
		Print(ctx, "%d", constant->iValue);
	else if(constant->type == VmType::Double)
		Print(ctx, "%f", constant->dValue);
	else if(constant->type == VmType::Long)
		Print(ctx, "%lldl", constant->lValue);
	else if(constant->type.type == VM_TYPE_POINTER && constant->container && constant->iValue)
		Print(ctx, "%.*s.v%04x+0x%x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, constant->iValue, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER && constant->container)
		Print(ctx, "%.*s.v%04x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER)
		Print(ctx, "0x%x", constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT)
		Print(ctx, "{ %.*s }", FMT_ISTR(constant->type.structType->name));
	else if(constant->type.type == VM_TYPE_BLOCK)
		Print(ctx, "%.*s.b%d", FMT_ISTR(constant->bValue->name), constant->bValue->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION && constant->fValue->function)
		Print(ctx, "%.*s.f%04x", FMT_ISTR(constant->fValue->function->name->name), constant->fValue->function->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION)
		Print(ctx, "global.f0000");
	else
		assert(!"unknown type");
}